

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdVexExceptionChecks(INSTRUX *Instrux)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  uint local_4c;
  ND_UINT32 i;
  INSTRUX *Instrux_local;
  byte local_38 [8];
  ND_UINT8 usedVects [32];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (((Instrux->Attributes & 0x400000000) == 0) || (((uint)Instrux->Exs >> 0x10 & 0xf) == 0)) {
    if (((Instrux->Attributes & 0x800000000) == 0) || (((uint)Instrux->Exs >> 0x14 & 1) == 0)) {
      if (((Instrux->Attributes & 0x80) != 0) && (Instrux->Category != ND_CAT_SCATTER)) {
        memset(local_38,0,0x20);
        for (local_4c = 0; local_4c < (Instrux->field_0x39 & 0xf); local_4c = local_4c + 1) {
          if (((undefined1  [32])
               ((undefined1  [32])Instrux->Operands[local_4c] & (undefined1  [32])0xf) ==
               (undefined1  [32])0x1) &&
             (Instrux->Operands[local_4c].Info.Register.Type == ND_REG_SSE)) {
            uVar3 = Instrux->Operands[local_4c].Info.Register.Reg;
            bVar1 = local_38[uVar3];
            local_38[uVar3] = bVar1 + 1;
            if (1 < (byte)(bVar1 + 1)) {
              Instrux_local._4_4_ = 0x80000031;
              goto LAB_001652a7;
            }
          }
          else if (((undefined1  [32])
                    ((undefined1  [32])Instrux->Operands[local_4c] & (undefined1  [32])0xf) ==
                    (undefined1  [32])0x2) &&
                  (bVar1 = Instrux->Operands[local_4c].Info.Memory.Index, bVar2 = local_38[bVar1],
                  local_38[bVar1] = bVar2 + 1, 1 < (byte)(bVar2 + 1))) {
            Instrux_local._4_4_ = 0x80000031;
            goto LAB_001652a7;
          }
        }
      }
      if ((Instrux->ExceptionType == '+') || (Instrux->ExceptionType == '1')) {
        if ((Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg) ||
           ((Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg ||
            (Instrux->Operands[1].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)))) {
          Instrux_local._4_4_ = 0x80000043;
          goto LAB_001652a7;
        }
      }
      else if ((Instrux->ExceptionType == '\x17') || (Instrux->ExceptionType == '#')) {
        if (((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) ==
             (undefined1  [32])0x1) &&
           (((undefined1  [32])((undefined1  [32])Instrux->Operands[2] & (undefined1  [32])0xf) ==
             (undefined1  [32])0x1 &&
            (Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)))) {
          Instrux_local._4_4_ = 0x80000044;
          goto LAB_001652a7;
        }
        if ((((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) ==
              (undefined1  [32])0x1) &&
            ((undefined1  [32])((undefined1  [32])Instrux->Operands[3] & (undefined1  [32])0xf) ==
             (undefined1  [32])0x1)) &&
           (Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[3].Info.Register.Reg)) {
          Instrux_local._4_4_ = 0x80000044;
          goto LAB_001652a7;
        }
      }
      else if (Instrux->ExceptionType == 'H') {
        if ((Instrux->Operands[0].Info.Register.Reg == 4) ||
           (Instrux->Operands[1].Info.Register.Reg == 4)) {
          Instrux_local._4_4_ = 0x80000044;
          goto LAB_001652a7;
        }
        if (((Instrux->Operands[0].Access.Access >> 1 & 1) != 0) &&
           (Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg)) {
          Instrux_local._4_4_ = 0x80000044;
          goto LAB_001652a7;
        }
      }
      Instrux_local._4_4_ = 0;
    }
    else {
      Instrux_local._4_4_ = 0x80000040;
    }
  }
  else {
    Instrux_local._4_4_ = 0x80000032;
  }
LAB_001652a7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdVexExceptionChecks(
    INSTRUX *Instrux
    )
{
    // These checks only apply to XOP/VEX/EVEX encoded instructions.

    // Instructions that don't use VEX/XOP/EVEX vvvv field must set it to 1111b/0 logic, otherwise a #UD will 
    // be generated.
    if ((Instrux->Attributes & ND_FLAG_NOV) && (0 != Instrux->Exs.v))
    {
        return ND_STATUS_VEX_VVVV_MUST_BE_ZERO;
    }

    // Instruction that don't use EVEX.V' field must set to to 1b/0 logic, otherwise a #UD will be generated.
    if ((Instrux->Attributes & ND_FLAG_NOVP) && (0 != Instrux->Exs.vp))
    {
        return ND_STATUS_BAD_EVEX_V_PRIME;
    }

    // VSIB instructions have a restriction: the same vector register can't be used by more than one operand.
    // The exception is SCATTER*, which can use the VSIB reg as two sources.
    if (ND_HAS_VSIB(Instrux) && Instrux->Category != ND_CAT_SCATTER)
    {
        ND_UINT8 usedVects[32] = { 0 };
        ND_UINT32 i;

        for (i = 0; i < Instrux->OperandsCount; i++)
        {
            if (Instrux->Operands[i].Type == ND_OP_REG && Instrux->Operands[i].Info.Register.Type == ND_REG_SSE)
            {
                if (++usedVects[Instrux->Operands[i].Info.Register.Reg] > 1)
                {
                    return ND_STATUS_INVALID_VSIB_REGS;
                }
            }
            else if (Instrux->Operands[i].Type == ND_OP_MEM)
            {
                if (++usedVects[Instrux->Operands[i].Info.Memory.Index] > 1)
                {
                    return ND_STATUS_INVALID_VSIB_REGS;
                }
            }
        }
    }

    // Handle AMX exception class.
    if (Instrux->ExceptionType == ND_EXT_AMX_E4 ||
        Instrux->ExceptionType == ND_EXT_AMX_E10)
    {
        // #UD if srcdest == src1, srcdest == src2 or src1 == src2. All three operands are tile regs.
        if (Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg ||
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg ||
            Instrux->Operands[1].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_TILE_REGS;
        }
    }

    // If E4* or E10* exception class is used (check out AVX512-FP16 instructions), an additional #UD case
    // exists: if the destination register is equal to either of the source registers.
    else if (Instrux->ExceptionType == ND_EXT_E4S || Instrux->ExceptionType == ND_EXT_E10S)
    {
        // Note that operand 0 is the destination, operand 1 is the mask, operand 2 is first source, operand
        // 3 is the second source.
        if (Instrux->Operands[0].Type == ND_OP_REG && Instrux->Operands[2].Type == ND_OP_REG &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }

        if (Instrux->Operands[0].Type == ND_OP_REG && Instrux->Operands[3].Type == ND_OP_REG &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[3].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }
    }

    // Handle PUSH2/POP2 exceptions, which have restrictions on the destination registers.
    else if (Instrux->ExceptionType == ND_EXT_APX_EVEX_PP2)
    {
        // The registers cannot be RSP for either PUSH2 or POP2.
        if (Instrux->Operands[0].Info.Register.Reg == NDR_RSP ||
            Instrux->Operands[1].Info.Register.Reg == NDR_RSP)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }

        // The destination registers cannot be the same for POP2.
        if (Instrux->Operands[0].Access.Write &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }
    }

    return ND_STATUS_SUCCESS;
}